

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O1

void __thiscall
myvk::SemaphoreStageGroup::Initialize
          (SemaphoreStageGroup *this,
          vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
          *stage_semaphores)

{
  pointer ppVVar1;
  pointer puVar2;
  pointer ppVar3;
  iterator __position;
  uint *__args;
  pointer ppVar4;
  VkSemaphore local_30;
  
  ppVVar1 = (this->m_semaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_semaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppVVar1) {
    (this->m_semaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVVar1;
  }
  puVar2 = (this->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  ppVar4 = (stage_semaphores->
           super__Vector_base<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (stage_semaphores->
           super__Vector_base<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar3) {
    __args = &ppVar4->second;
    do {
      local_30 = ((((pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int> *)(__args + -4))->first).
                  super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_semaphore;
      std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::emplace_back<VkSemaphore_T*>
                ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)this,&local_30);
      __position._M_current =
           (this->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_stages,__position,
                   __args);
      }
      else {
        *__position._M_current = *__args;
        (this->m_stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      ppVar4 = (pointer)(__args + 2);
      __args = __args + 6;
    } while (ppVar4 != ppVar3);
  }
  return;
}

Assistant:

void SemaphoreStageGroup::Initialize(
    const std::vector<std::pair<Ptr<Semaphore>, VkPipelineStageFlags>> &stage_semaphores) {
	m_semaphores.clear();
	m_stages.clear();
	for (const auto &i : stage_semaphores) {
		m_semaphores.push_back(i.first->GetHandle());
		m_stages.push_back(i.second);
	}
}